

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsObject.c
# Opt level: O0

void JsStandardHasProperty(JsObject *self,char *prop,JsValue *res)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  JsStandardSelfBlock *sb;
  JsProperty *p;
  int size;
  int i;
  JsValue *res_local;
  char *prop_local;
  JsObject *self_local;
  
  res->type = JS_BOOLEAN;
  puVar1 = (undefined8 *)*self->sb;
  JsLockup((JsLock)puVar1[2]);
  iVar2 = JsListSize((void *)*puVar1);
  p._4_4_ = 0;
  while( true ) {
    if (iVar2 <= p._4_4_) {
      JsUnlock((JsLock)puVar1[2]);
      if (self->Prototype == (JsObject *)0x0) {
        (res->u).boolean = 0;
      }
      else {
        (*self->Prototype->HasProperty)(self->Prototype,prop,res);
      }
      return;
    }
    puVar4 = (undefined8 *)JsListGet((void *)*puVar1,p._4_4_);
    iVar3 = strcmp((char *)*puVar4,prop);
    if (iVar3 == 0) break;
    p._4_4_ = p._4_4_ + 1;
  }
  JsUnlock((JsLock)puVar1[2]);
  (res->u).boolean = 1;
  return;
}

Assistant:

void JsStandardHasProperty(struct JsObject *self, char *prop,struct JsValue* res){
	int i,size;
	struct JsProperty* p;
	struct JsStandardSelfBlock* sb;
	res->type = JS_BOOLEAN;
	sb = (struct JsStandardSelfBlock*)self->sb[JS_STANDARD_OBJECT_FLOOR];
	JsLockup(sb->lock);
	size = JsListSize(sb->propertys);
	for(i=0;i<size;++i){
		p = (struct JsProperty*)JsListGet(sb->propertys,i);
		if(strcmp(p->name,prop) == 0){
			JsUnlock(sb->lock);
			res->u.boolean = TRUE;
			return;
		}
	}
	JsUnlock(sb->lock);
	if(!self->Prototype){
		res->u.boolean = FALSE;
		return;
	}
	return ((*self->Prototype->HasProperty)(self->Prototype,prop,res));
}